

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# controls.c
# Opt level: O0

void FormatKey(char *buffer,char key)

{
  uint uVar1;
  char key_local;
  char *buffer_local;
  
  if (key == '\b') {
    sprintf(buffer,"bkspc");
  }
  else if (key == '\t') {
    sprintf(buffer,"tab");
  }
  else if (key == '\n') {
    sprintf(buffer,"enter");
  }
  else if (key == '\x1b') {
    sprintf(buffer,"esc");
  }
  else if (key == ' ') {
    sprintf(buffer,"space");
  }
  else if (key == '\x7f') {
    sprintf(buffer,"del");
  }
  else {
    uVar1 = toupper((int)key);
    sprintf(buffer,"%c",(ulong)uVar1);
  }
  return;
}

Assistant:

static void FormatKey(char* buffer, char key)
{
  switch (key) {
    case ' ': sprintf(buffer, "space"); break;
    case '\n': sprintf(buffer, "enter"); break;
    case '\b': sprintf(buffer, "bkspc"); break;
    case '\t': sprintf(buffer, "tab"); break;
    case '\x1B': sprintf(buffer, "esc"); break;
    case '\x7f': sprintf(buffer, "del"); break;
    default: sprintf(buffer, "%c", toupper(key)); break;
  }
}